

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O2

String * Unicode::toString(String *__return_storage_ptr__,uint32 ch)

{
  String::String(__return_storage_ptr__,4);
  append(ch,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static String toString(uint32 ch)
  {
#ifdef _UNICODE
    String result(2);
#else
    String result(4);
#endif
    append(ch, result);
    return result;
  }